

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManDupCones_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,
                        Vec_Ptr_t *vRoots)

{
  int iVar1;
  ulong uVar2;
  
  while( true ) {
    iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
    if (iVar1 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = (int)*(ulong *)pObj;
    uVar2 = *(ulong *)pObj & 0x1fffffff;
    if (-1 < iVar1 && uVar2 != 0x1fffffff) break;
    if ((-1 < iVar1) || ((int)uVar2 == 0x1fffffff)) {
      iVar1 = Gia_ObjIsRo(p,pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsPi(p,pObj);
        vRoots = vLeaves;
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                        ,0xd66,
                        "void Gia_ManDupCones_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
      }
      else {
        pObj = Gia_ObjRoToRi(p,pObj);
      }
      goto LAB_001dc887;
    }
    pObj = pObj + -uVar2;
  }
  Gia_ManDupCones_rec(p,pObj + -uVar2,vLeaves,vNodes,vRoots);
  Gia_ManDupCones_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vLeaves,vNodes,
                      vRoots);
  vRoots = vNodes;
LAB_001dc887:
  Vec_PtrPush(vRoots,pObj);
  return;
}

Assistant:

void Gia_ManDupCones_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Ptr_t * vRoots )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManDupCones_rec( p, Gia_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
        Gia_ManDupCones_rec( p, Gia_ObjFanin1(pObj), vLeaves, vNodes, vRoots );
        Vec_PtrPush( vNodes, pObj );
    }
    else if ( Gia_ObjIsCo(pObj) )
        Gia_ManDupCones_rec( p, Gia_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_PtrPush( vRoots, Gia_ObjRoToRi(p, pObj) );
    else if ( Gia_ObjIsPi(p, pObj) )
        Vec_PtrPush( vLeaves, pObj );
    else assert( 0 );
}